

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O1

uint64_t fibonacci(uint64_t n)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar3;
  
  uVar1 = 1;
  if (2 < n) {
    uVar3 = 4;
    if (4 < n + 1) {
      uVar3 = n + 1;
    }
    lVar2 = uVar3 - 3;
    uVar1 = 1;
    uVar5 = 1;
    do {
      uVar4 = uVar1;
      uVar1 = uVar5 + uVar4;
      lVar2 = lVar2 + -1;
      uVar5 = uVar4;
    } while (lVar2 != 0);
  }
  return uVar1;
}

Assistant:

uint64_t fibonacci(uint64_t n)
{
    uint64_t a = 1, b = 1;
    for (uint64_t i = 3; i <= n; ++i)
    {
        uint64_t c = a + b;
        a = b;
        b = c;
    }
    return b;
}